

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-cave-view.c
# Opt level: O0

_Bool borg_update_view_aux(int y,int x,int y1,int x1,int y2,int x2)

{
  _Bool _Var1;
  _Bool _Var2;
  uint8_t uVar3;
  borg_grid *ag_00;
  borg_grid *ag_01;
  borg_grid *ag_02;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  borg_grid *g2_ag;
  borg_grid *g1_ag;
  borg_grid *ag;
  _Bool wall;
  _Bool vis2;
  _Bool vis1;
  _Bool v2;
  _Bool v1;
  _Bool f2;
  _Bool f1;
  int x2_local;
  int y2_local;
  int x1_local;
  int y1_local;
  int x_local;
  int y_local;
  uint8_t uVar4;
  
  ag_00 = borg_grids[y1] + x1;
  ag_01 = borg_grids[y2] + x2;
  _Var1 = borg_cave_floor_grid(ag_00);
  _Var2 = borg_cave_floor_grid(ag_01);
  if ((_Var1) || (_Var2)) {
    bVar5 = false;
    if (_Var1) {
      bVar5 = (ag_00->info & 0x20) != 0;
    }
    bVar6 = false;
    if (_Var2) {
      bVar6 = (ag_01->info & 0x20) != 0;
    }
    if ((bVar5) || (bVar6)) {
      ag_02 = borg_grids[y] + x;
      _Var1 = borg_cave_floor_grid(ag_02);
      x_local._3_1_ = (_Bool)((_Var1 ^ 0xffU) & 1);
      bVar7 = false;
      if (bVar5) {
        bVar7 = (ag_00->info & 0x80) != 0;
      }
      bVar8 = false;
      if (bVar6) {
        bVar8 = (ag_01->info & 0x80) != 0;
      }
      uVar3 = (uint8_t)y;
      uVar4 = (uint8_t)x;
      if ((bVar7) && (bVar8)) {
        ag_02->info = ag_02->info | 0x80;
        ag_02->info = ag_02->info | 0x20;
        borg_view_y[borg_view_n] = uVar3;
        borg_view_x[borg_view_n] = uVar4;
        borg_view_n = borg_view_n + 1;
      }
      else if (bVar7) {
        ag_02->info = ag_02->info | 0x20;
        borg_view_y[borg_view_n] = uVar3;
        borg_view_x[borg_view_n] = uVar4;
        borg_view_n = borg_view_n + 1;
      }
      else if ((bVar5) && (bVar6)) {
        ag_02->info = ag_02->info | 0x20;
        borg_view_y[borg_view_n] = uVar3;
        borg_view_x[borg_view_n] = uVar4;
        borg_view_n = borg_view_n + 1;
      }
      else if (x_local._3_1_ == false) {
        _Var1 = borg_los(borg.c.y,borg.c.x,y,x);
        if (_Var1) {
          ag_02->info = ag_02->info | 0x20;
          borg_view_y[borg_view_n] = uVar3;
          borg_view_x[borg_view_n] = uVar4;
          borg_view_n = borg_view_n + 1;
        }
        else {
          x_local._3_1_ = true;
        }
      }
      else {
        ag_02->info = ag_02->info | 0x20;
        borg_view_y[borg_view_n] = uVar3;
        borg_view_x[borg_view_n] = uVar4;
        borg_view_n = borg_view_n + 1;
      }
    }
    else {
      x_local._3_1_ = true;
    }
  }
  else {
    x_local._3_1_ = true;
  }
  return x_local._3_1_;
}

Assistant:

static bool borg_update_view_aux(int y, int x, int y1, int x1, int y2, int x2)
{
    bool f1, f2, v1, v2, vis1, vis2, wall;

    borg_grid *ag;

    borg_grid *g1_ag;
    borg_grid *g2_ag;

    /* Access the grids */
    g1_ag = &borg_grids[y1][x1];
    g2_ag = &borg_grids[y2][x2];

    /* Check for walls */
    f1 = (borg_cave_floor_grid(g1_ag));
    f2 = (borg_cave_floor_grid(g2_ag));

    /* Totally blocked by physical walls */
    if (!f1 && !f2)
        return true;

    /* Check for visibility */
    v1 = (f1 && (g1_ag->info & BORG_VIEW));
    v2 = (f2 && (g2_ag->info & BORG_VIEW));

    /* Totally blocked by "unviewable neighbors" */
    if (!v1 && !v2)
        return true;

    /* Access the grid */
    ag = &borg_grids[y][x];

    /* Check for walls */
    wall = (!borg_cave_floor_grid(ag));

    /* Check the "ease" of visibility */
    vis1 = (v1 && (g1_ag->info & BORG_XTRA));
    vis2 = (v2 && (g2_ag->info & BORG_XTRA));

    /* Hack -- "easy" plus "easy" yields "easy" */
    if (vis1 && vis2) {
        ag->info |= BORG_XTRA;

        borg_cave_view_hack(ag, y, x);

        return wall;
    }

    /* Hack -- primary "easy" yields "viewed" */
    if (vis1) {
        borg_cave_view_hack(ag, y, x);

        return wall;
    }

    /* Hack -- "view" plus "view" yields "view" */
    if (v1 && v2) {
        /* ag->info |= BORG_XTRA; */

        borg_cave_view_hack(ag, y, x);

        return wall;
    }

    /* Mega-Hack -- the "borg_los()" function works poorly on walls */
    if (wall) {
        borg_cave_view_hack(ag, y, x);

        return wall;
    }

    /* Hack -- check line of sight */
    if (borg_los(borg.c.y, borg.c.x, y, x)) {
        borg_cave_view_hack(ag, y, x);

        return wall;
    }

    /* Assume no line of sight. */
    return true;
}